

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

char * fmt::v10::detail::parse_dynamic_spec<char>
                 (char *begin,char *end,int *value,arg_ref<char> *ref,
                 basic_format_parse_context<char> *ctx)

{
  char cVar1;
  int iVar2;
  dynamic_spec_id_handler<char> *handler_00;
  dynamic_spec_id_handler<char> *in_RCX;
  char **in_RDX;
  dynamic_spec_id_handler<char> *in_RSI;
  dynamic_spec_id_handler<char> *in_RDI;
  char *in_R8;
  dynamic_spec_id_handler<char> handler;
  int val;
  char c;
  int in_stack_ffffffffffffff8c;
  char *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  char *in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd8;
  
  if (in_RDI == in_RSI) {
    assert_fail(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,(char *)0x133523);
  }
  if ((*(char *)&in_RDI->ctx < '0') || ('9' < *(char *)&in_RDI->ctx)) {
    if (*(char *)&in_RDI->ctx == '{') {
      handler_00 = (dynamic_spec_id_handler<char> *)((long)&in_RDI->ctx + 1);
      if (handler_00 != in_RSI) {
        if (handler_00 == in_RSI) {
          assert_fail(in_R8,in_stack_ffffffffffffff8c,(char *)0x13361a);
        }
        cVar1 = *(char *)&handler_00->ctx;
        if ((cVar1 == '}') || (cVar1 == ':')) {
          dynamic_spec_id_handler<char>::on_auto(in_RCX);
        }
        else {
          handler_00 = (dynamic_spec_id_handler<char> *)
                       do_parse_arg_id<char,fmt::v10::detail::dynamic_spec_id_handler<char>&>
                                 ((char *)CONCAT17(cVar1,in_stack_ffffffffffffffd8),
                                  in_stack_ffffffffffffffd0,handler_00);
        }
      }
      if ((handler_00 == in_RSI) || (*(char *)&handler_00->ctx != '}')) {
        throw_format_error((char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      }
      in_RDI = (dynamic_spec_id_handler<char> *)((long)&handler_00->ctx + 1);
    }
  }
  else {
    iVar2 = parse_nonnegative_int<char>(in_RDX,(char *)in_RCX,(int)((ulong)in_R8 >> 0x20));
    if (iVar2 == -1) {
      throw_format_error((char *)CONCAT44(0xffffffff,in_stack_ffffffffffffffa0));
    }
    *(int *)in_RDX = iVar2;
  }
  return (char *)in_RDI;
}

Assistant:

FMT_CONSTEXPR auto parse_dynamic_spec(const Char* begin, const Char* end,
                                      int& value, arg_ref<Char>& ref,
                                      basic_format_parse_context<Char>& ctx)
    -> const Char* {
  FMT_ASSERT(begin != end, "");
  if ('0' <= *begin && *begin <= '9') {
    int val = parse_nonnegative_int(begin, end, -1);
    if (val != -1)
      value = val;
    else
      throw_format_error("number is too big");
  } else if (*begin == '{') {
    ++begin;
    auto handler = dynamic_spec_id_handler<Char>{ctx, ref};
    if (begin != end) begin = parse_arg_id(begin, end, handler);
    if (begin != end && *begin == '}') return ++begin;
    throw_format_error("invalid format string");
  }
  return begin;
}